

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_flush_cookies(Curl_easy *data,int cleanup)

{
  curl_slist *list;
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  Cookie *co;
  
  if ((data->set).str[3] == (char *)0x0) {
    if ((cleanup != 0) && (list = (data->change).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->change).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  }
  else {
    if ((data->change).cookielist != (curl_slist *)0x0) {
      Curl_cookie_loadfiles(data);
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    co = (Cookie *)data->cookies;
    if ((co != (Cookie *)0x0) && (co->path != (char *)0x0)) {
      pcVar2 = (data->set).str[3];
      remove_expired((CookieInfo *)co);
      iVar1 = curl_strequal("-",pcVar2);
      __stream = _stdout;
      if ((iVar1 != 0) || (__stream = fopen64(pcVar2,"w"), __stream != (FILE *)0x0)) {
        fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
              ,__stream);
        while (co = co->next, co != (Cookie *)0x0) {
          if (co->domain != (char *)0x0) {
            pcVar2 = get_netscape_format(co);
            if (pcVar2 == (char *)0x0) {
              curl_mfprintf((FILE *)__stream,"#\n# Fatal libcurl error\n");
              if (iVar1 != 0) goto LAB_00116562;
              goto LAB_00116555;
            }
            curl_mfprintf((FILE *)__stream,"%s\n",pcVar2);
            (*Curl_cfree)(pcVar2);
          }
        }
        if (iVar1 != 0) goto LAB_0011657a;
LAB_00116555:
        fclose(__stream);
        if (co == (Cookie *)0x0) goto LAB_0011657a;
      }
LAB_00116562:
      Curl_infof(data,"WARNING: failed to save cookies in %s\n",(data->set).str[3]);
    }
  }
LAB_0011657a:
  if (cleanup != 0) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, int cleanup)
{
  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->change.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    if(cookie_output(data->cookies, data->set.str[STRING_COOKIEJAR]))
      infof(data, "WARNING: failed to save cookies in %s\n",
            data->set.str[STRING_COOKIEJAR]);
  }
  else {
    if(cleanup && data->change.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->change.cookielist); /* clean up list */
      data->change.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}